

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O0

ReadFileResult anon_unknown.dwarf_2d3363::ResourceIdHelper(string *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  char *string;
  undefined1 local_128 [8];
  RegularExpressionMatch match;
  allocator<char> local_69;
  string local_68;
  cmJSONHelper<std::string,_cmCTestResourceSpec::ReadFileResult> local_48;
  ReadFileResult local_24;
  Value *pVStack_20;
  ReadFileResult result;
  Value *value_local;
  string *out_local;
  
  pVStack_20 = value;
  value_local = (Value *)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::String
            (&local_48,READ_OK,INVALID_RESOURCE,&local_68);
  RVar2 = std::
          function<cmCTestResourceSpec::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::operator()(&local_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       value_local,pVStack_20);
  std::
  function<cmCTestResourceSpec::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::~function(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  out_local._4_4_ = RVar2;
  if (RVar2 == READ_OK) {
    local_24 = RVar2;
    cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_128);
    string = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)(anonymous_namespace)::IdRegex,string,
                       (RegularExpressionMatch *)local_128);
    if (bVar1) {
      out_local._4_4_ = READ_OK;
    }
    else {
      out_local._4_4_ = INVALID_RESOURCE;
    }
  }
  return out_local._4_4_;
}

Assistant:

cmCTestResourceSpec::ReadFileResult ResourceIdHelper(std::string& out,
                                                     const Json::Value* value)
{
  auto result = JSONHelperBuilder::String(
    cmCTestResourceSpec::ReadFileResult::READ_OK,
    cmCTestResourceSpec::ReadFileResult::INVALID_RESOURCE)(out, value);
  if (result != cmCTestResourceSpec::ReadFileResult::READ_OK) {
    return result;
  }
  cmsys::RegularExpressionMatch match;
  if (!IdRegex.find(out.c_str(), match)) {
    return cmCTestResourceSpec::ReadFileResult::INVALID_RESOURCE;
  }
  return cmCTestResourceSpec::ReadFileResult::READ_OK;
}